

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedRotaryWingAircraft.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::GED_EnhancedRotaryWingAircraft::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GED_EnhancedRotaryWingAircraft *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  GED_BasicRotorWingAircraft::GetAsString_abi_cxx11_
            (&local_1c0,&this->super_GED_BasicRotorWingAircraft);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"GED Enhanced Rotary Wing Aircraft\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\tFuel Status:               ",0x1c)
  ;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0 Liters\n",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tAir Maintenance Status:    ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0 km\n",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tPrimary Ammunition:        ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tSecondary Ammunition:      ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString GED_EnhancedRotaryWingAircraft::GetAsString() const
{
    KStringStream ss;

    ss << GED_BasicRotorWingAircraft::GetAsString();

    ss << "GED Enhanced Rotary Wing Aircraft\n"
       << "\tFuel Status:               " << ( KUINT16 )m_ui8SupFuelStatus   << "0 Liters\n"
       << "\tAir Maintenance Status:    " << ( KUINT16 )m_ui8AirMaintStatus  << "0 km\n"
       << "\tPrimary Ammunition:        " << ( KUINT16 )m_ui8PriAmmun        << "\n"
       << "\tSecondary Ammunition:      " << ( KUINT16 )m_ui8SecAmmun        << "\n";

    return ss.str();
}